

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool __thiscall
llvm::cl::parser<llvm::cl::boolOrDefault>::parse
          (parser<llvm::cl::boolOrDefault> *this,Option *O,StringRef ArgName,StringRef Arg,
          boolOrDefault *Value)

{
  int iVar1;
  raw_ostream *Errs;
  int *__s1;
  StringRef Arg_local;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  Arg_local.Length = Arg.Length;
  __s1 = (int *)Arg.Data;
  Arg_local.Data = (char *)__s1;
  switch(Arg_local.Length) {
  case 0:
    break;
  case 1:
    if ((char)*__s1 != '1') {
      if ((char)*__s1 == '0') goto LAB_00169ae7;
      goto switchD_00169a0e_caseD_2;
    }
    break;
  case 4:
    if (((*__s1 != 0x65757274) && (*__s1 != 0x45555254)) && (*__s1 != 0x65757254))
    goto switchD_00169a0e_caseD_2;
    break;
  case 5:
    iVar1 = bcmp(__s1,"false",5);
    if (((iVar1 == 0) || (iVar1 = bcmp(__s1,"FALSE",5), iVar1 == 0)) ||
       (iVar1 = bcmp(__s1,"False",5), iVar1 == 0)) {
LAB_00169ae7:
      *Value = BOU_FALSE;
      return false;
    }
  default:
switchD_00169a0e_caseD_2:
    Twine::Twine(&local_50,"\'",&Arg_local);
    Twine::Twine(&local_68,"\' is invalid value for boolean argument! Try 0 or 1");
    Twine::concat(&local_38,&local_50,&local_68);
    Errs = errs();
    Option::error(O,&local_38,(StringRef)ZEXT816(0),Errs);
    return true;
  }
  *Value = BOU_TRUE;
  return false;
}

Assistant:

bool parser<boolOrDefault>::parse(Option &O, StringRef ArgName, StringRef Arg,
                                  boolOrDefault &Value) {
  if (Arg == "" || Arg == "true" || Arg == "TRUE" || Arg == "True" ||
      Arg == "1") {
    Value = BOU_TRUE;
    return false;
  }
  if (Arg == "false" || Arg == "FALSE" || Arg == "False" || Arg == "0") {
    Value = BOU_FALSE;
    return false;
  }

  return O.error("'" + Arg +
                 "' is invalid value for boolean argument! Try 0 or 1");
}